

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QPoint __thiscall QIconModeViewBase::draggedItemsDelta(QIconModeViewBase *this)

{
  QListViewPrivate *pQVar1;
  QPoint QVar2;
  QPoint QVar3;
  QPoint QVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QCommonListViewBase).dd;
  if (pQVar1->movement == Snap) {
    QVar2 = QCommonListViewBase::offset(&this->super_QCommonListViewBase);
    iVar6 = (((this->super_QCommonListViewBase).dd)->grid).wd.m_i;
    QVar3 = QCommonListViewBase::offset(&this->super_QCommonListViewBase);
    pQVar1 = (this->super_QCommonListViewBase).dd;
    iVar5 = QVar3.yp.m_i.m_i % (pQVar1->grid).ht.m_i;
    iVar6 = (int)((long)((ulong)(uint)(QVar2.xp.m_i.m_i >> 0x1f) << 0x20 | (ulong)QVar2 & 0xffffffff
                        ) % (long)iVar6);
    local_40.xp.m_i = (this->draggedItemsPos).xp.m_i + iVar6;
    local_40.yp.m_i = (this->draggedItemsPos).yp.m_i + iVar5;
    QVar2 = snapToGrid(this,&local_40);
    local_48 = (pQVar1->super_QAbstractItemViewPrivate).pressedPosition;
    QVar4 = snapToGrid(this,&local_48);
    QVar3.xp.m_i = (QVar2.xp.m_i.m_i - QVar4.xp.m_i) - iVar6;
    QVar3.yp.m_i = QVar2.yp.m_i.m_i - (QVar4.yp.m_i.m_i + iVar5);
  }
  else {
    QVar2 = (pQVar1->super_QAbstractItemViewPrivate).pressedPosition;
    QVar3.xp.m_i = (this->draggedItemsPos).xp.m_i - QVar2.xp.m_i;
    QVar3.yp.m_i = (this->draggedItemsPos).yp.m_i - QVar2.yp.m_i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QIconModeViewBase::draggedItemsDelta() const
{
    if (movement() == QListView::Snap) {
        QPoint snapdelta = QPoint((offset().x() % gridSize().width()),
                                  (offset().y() % gridSize().height()));
        return snapToGrid(draggedItemsPos + snapdelta) - snapToGrid(pressedPosition()) - snapdelta;
    }
    return draggedItemsPos - pressedPosition();
}